

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void __thiscall
gguf_kv::gguf_kv<bool>(gguf_kv *this,string *key,vector<bool,_std::allocator<bool>_> *value)

{
  const_reference cVar1;
  size_t i;
  ulong __n;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  this->is_array = true;
  this->type = GGUF_TYPE_BOOL;
  (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (key->_M_string_length != 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (&this->data,
               (ulong)(value->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
               ((long)(value->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)(value->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
    for (__n = 0; __n < (ulong)(value->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                        + ((long)(value->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                          (long)(value->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8
        ; __n = __n + 1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](value,__n);
      (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[__n] = cVar1;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x8c,
             "GGML_ASSERT(%s) failed","!key.empty()");
}

Assistant:

gguf_kv(const std::string & key, const std::vector<T> & value)
            : key(key), is_array(true), type(type_to_gguf_type<T>::value) {
        GGML_ASSERT(!key.empty());
        data.resize(value.size()*sizeof(T));
        for (size_t i = 0; i < value.size(); ++i) {
            const T tmp = value[i];
            memcpy(data.data() + i*sizeof(T), &tmp, sizeof(T));
        }
    }